

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smooth_test.cpp
# Opt level: O2

void __thiscall Smooth_Normals_Test::~Smooth_Normals_Test(Smooth_Normals_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Smooth, Normals) {
  Manifold cylinder = Manifold::Cylinder(10, 5, 5, 8);
  Manifold out = cylinder.SmoothOut().RefineToLength(0.1);
  Manifold byNormals =
      cylinder.CalculateNormals(0).SmoothByNormals(0).RefineToLength(0.1);
  EXPECT_FLOAT_EQ(out.Volume(), byNormals.Volume());
  EXPECT_FLOAT_EQ(out.SurfaceArea(), byNormals.SurfaceArea());

#ifdef MANIFOLD_EXPORT
  if (options.exportModels)
    ExportMesh("smoothNormals.glb", byNormals.GetMeshGL(), {});
#endif
}